

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

int __thiscall
kratos::ForStmt::clone(ForStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_type *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer this_01;
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 local_48 [24];
  pointer local_30;
  pointer local_28;
  
  std::__shared_ptr<kratos::ForStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::ForStmt>,std::__cxx11::string&,long_const&,long_const&,long_const&>
            ((__shared_ptr<kratos::ForStmt,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (allocator<kratos::ForStmt> *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(__fn + 0xc0) + 0x78),(long *)(__fn + 0xd0),(long *)(__fn + 0xd8),
             (long *)(__fn + 0xe0));
  (**(code **)(**(long **)(__fn + 0xe8) + 0x58))(local_58);
  Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_48);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (pointer)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30[6].first._M_dataplus._M_p;
  *(undefined8 *)&local_30[5].second = uVar2;
  local_30[6].first._M_dataplus._M_p = (pointer)uVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((pointer)local_48._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  (**(code **)(**(long **)&local_30[5].second + 0x38))();
  *(undefined8 *)&local_30[4].second = *(undefined8 *)(__fn + 0xc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 5),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(__fn + 200));
  this_01 = local_28;
  if (local_28 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_28->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_28->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_30->second = *(uint *)(__fn + 0x20);
  std::__cxx11::string::_M_assign((string *)(local_30 + 1));
  if (this_01 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)local_30;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_28;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> ForStmt::clone() const {
    auto stmt = std::make_shared<ForStmt>(iter_->name, start_, end_, step_);
    stmt->loop_body_ = loop_body_->clone()->as<ScopedStmtBlock>();
    stmt->loop_body_->set_parent(stmt.get());
    // share the iter expression
    stmt->iter_ = iter_;
    copy_meta(stmt);
    return stmt;
}